

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[27],std::__cxx11::string&,char_const(&)[79],std::__cxx11::string_const&,char_const(&)[3]>
                   (string *__return_storage_ptr__,char (*a) [10],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [27],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [79],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [3])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d8;
  size_type local_c0;
  pointer local_b8;
  undefined8 local_b0;
  size_t local_a8;
  char (*local_a0) [27];
  undefined8 local_98;
  size_type local_90;
  pointer local_88;
  undefined8 local_80;
  size_t local_78;
  char (*local_70) [79];
  undefined8 local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  size_t local_48;
  char (*local_40) [3];
  undefined8 local_38;
  
  local_d8.first._M_len = strlen(*a);
  local_d8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (b->_M_dataplus)._M_p;
  local_c0 = b->_M_string_length;
  local_b0 = 0;
  local_d8.first._M_str = *a;
  local_a8 = strlen(*args);
  local_98 = 0;
  local_88 = (args_1->_M_dataplus)._M_p;
  local_90 = args_1->_M_string_length;
  local_80 = 0;
  local_a0 = args;
  local_78 = strlen(*args_2);
  local_68 = 0;
  local_58 = (args_3->_M_dataplus)._M_p;
  local_60 = args_3->_M_string_length;
  local_50 = 0;
  local_70 = args_2;
  local_48 = strlen(*args_4);
  local_40 = args_4;
  local_38 = 0;
  views._M_len = 7;
  views._M_array = &local_d8;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}